

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Compiler.cpp
# Opt level: O3

vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
* soul::Compiler::parseTopLevelDeclarations
            (vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
             *__return_storage_ptr__,Allocator *allocator,CodeLocation *code,
            Namespace *parentNamespace)

{
  CodeLocation local_18;
  
  local_18.sourceCode.object = (code->sourceCode).object;
  if (local_18.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_18.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_18.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_18.location.data = (code->location).data;
  StructuralParser::parseTopLevelDeclarations
            (__return_storage_ptr__,allocator,&local_18,parentNamespace);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_18.sourceCode.object);
  return __return_storage_ptr__;
}

Assistant:

std::vector<pool_ref<AST::ModuleBase>> Compiler::parseTopLevelDeclarations (AST::Allocator& allocator, CodeLocation code,
                                                                            AST::Namespace& parentNamespace)
{
    return StructuralParser::parseTopLevelDeclarations (allocator, code, parentNamespace);
}